

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O0

void mutex_owner_stats_update(tsdn_t *tsdn,malloc_mutex_t *mutex)

{
  mutex_prof_data_t *data;
  malloc_mutex_t *mutex_local;
  tsdn_t *tsdn_local;
  
  (mutex->field_0).field_0.prof_data.n_lock_ops = (mutex->field_0).field_0.prof_data.n_lock_ops + 1;
  if ((mutex->field_0).field_0.prof_data.prev_owner != tsdn) {
    (mutex->field_0).field_0.prof_data.prev_owner = tsdn;
    (mutex->field_0).witness.link.qre_prev =
         (witness_t *)((long)&((mutex->field_0).witness.link.qre_prev)->name + 1);
  }
  return;
}

Assistant:

static inline void
mutex_owner_stats_update(tsdn_t *tsdn, malloc_mutex_t *mutex) {
	if (config_stats) {
		mutex_prof_data_t *data = &mutex->prof_data;
		data->n_lock_ops++;
		if (data->prev_owner != tsdn) {
			data->prev_owner = tsdn;
			data->n_owner_switches++;
		}
	}
}